

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cache.cc
# Opt level: O0

void __thiscall leveldb::anon_unknown_0::LRUCache::Prune(LRUCache *this)

{
  LRUHandle *e_00;
  Slice SVar1;
  Slice local_38;
  undefined1 local_21;
  LRUHandle *pLStack_20;
  bool erased;
  LRUHandle *e;
  MutexLock l;
  LRUCache *this_local;
  
  l.mu_ = (Mutex *)this;
  MutexLock::MutexLock((MutexLock *)&e,&this->mutex_);
  while( true ) {
    if ((this->lru_).next == &this->lru_) {
      MutexLock::~MutexLock((MutexLock *)&e);
      return;
    }
    pLStack_20 = (this->lru_).next;
    if (pLStack_20->refs != 1) break;
    SVar1 = LRUHandle::key(pLStack_20);
    local_38 = SVar1;
    e_00 = HandleTable::Remove(&this->table_,&local_38,pLStack_20->hash);
    local_21 = FinishErase(this,e_00);
    if ((!(bool)local_21) && (!(bool)local_21)) {
      __assert_fail("erased",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/util/cache.cc"
                    ,0x14a,"void leveldb::(anonymous namespace)::LRUCache::Prune()");
    }
  }
  __assert_fail("e->refs == 1",
                "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/util/cache.cc"
                ,0x147,"void leveldb::(anonymous namespace)::LRUCache::Prune()");
}

Assistant:

void LRUCache::Prune() {
  MutexLock l(&mutex_);
  while (lru_.next != &lru_) {
    LRUHandle* e = lru_.next;
    assert(e->refs == 1);
    bool erased = FinishErase(table_.Remove(e->key(), e->hash));
    if (!erased) {  // to avoid unused variable when compiled NDEBUG
      assert(erased);
    }
  }
}